

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O2

unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_> __thiscall
llvm::WritableMemoryBuffer::getNewUninitMemBuffer
          (WritableMemoryBuffer *this,size_t Size,Twine *BufferName)

{
  MemoryBuffer *this_00;
  size_t __n;
  ulong uVar1;
  EVP_PKEY_CTX *ctx;
  StringRef SVar2;
  SmallString<256U> NameBuf;
  
  NameBuf.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX =
       &NameBuf.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>;
  NameBuf.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  NameBuf.super_SmallVector<char,_256U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  SVar2 = Twine::toStringRef(BufferName,(SmallVectorImpl<char> *)&NameBuf);
  __n = SVar2.Length;
  uVar1 = __n + 0x28 & 0xfffffffffffffff0;
  this_00 = (MemoryBuffer *)operator_new(Size + uVar1 + 1,(nothrow_t *)&std::nothrow);
  if (this_00 != (MemoryBuffer *)0x0) {
    if (__n != 0) {
      memcpy(this_00 + 1,SVar2.Data,__n);
    }
    *(undefined1 *)((long)&this_00[1]._vptr_MemoryBuffer + __n) = 0;
    ctx = (EVP_PKEY_CTX *)((long)&this_00->_vptr_MemoryBuffer + uVar1);
    ctx[Size] = (EVP_PKEY_CTX)0x0;
    this_00->_vptr_MemoryBuffer = (_func_int **)&PTR__MemoryBuffer_001dbfa8;
    MemoryBuffer::init(this_00,ctx);
  }
  (this->super_MemoryBuffer)._vptr_MemoryBuffer = (_func_int **)this_00;
  SmallVectorImpl<char>::~SmallVectorImpl((SmallVectorImpl<char> *)&NameBuf);
  return (__uniq_ptr_data<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>,_true,_true>
          )(__uniq_ptr_data<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<WritableMemoryBuffer>
WritableMemoryBuffer::getNewUninitMemBuffer(size_t Size, const Twine &BufferName) {
  using MemBuffer = MemoryBufferMem<WritableMemoryBuffer>;
  // Allocate space for the MemoryBuffer, the data and the name. It is important
  // that MemoryBuffer and data are aligned so PointerIntPair works with them.
  // TODO: Is 16-byte alignment enough?  We copy small object files with large
  // alignment expectations into this buffer.
  SmallString<256> NameBuf;
  StringRef NameRef = BufferName.toStringRef(NameBuf);
  size_t AlignedStringLen = alignTo(sizeof(MemBuffer) + NameRef.size() + 1, 16);
  size_t RealLen = AlignedStringLen + Size + 1;
  char *Mem = static_cast<char*>(operator new(RealLen, std::nothrow));
  if (!Mem)
    return nullptr;

  // The name is stored after the class itself.
  CopyStringRef(Mem + sizeof(MemBuffer), NameRef);

  // The buffer begins after the name and must be aligned.
  char *Buf = Mem + AlignedStringLen;
  Buf[Size] = 0; // Null terminate buffer.

  auto *Ret = new (Mem) MemBuffer(StringRef(Buf, Size), true);
  return std::unique_ptr<WritableMemoryBuffer>(Ret);
}